

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O2

converter_t converter_open(void)

{
  spseg_buffer_desc *ossb;
  
  ossb = (spseg_buffer_desc *)malloc(0x48);
  ossb->initialized = 0;
  ossb->match_length = (size_t *)0x0;
  ossb->min_len = (size_t *)0x0;
  ossb->parent = (size_t *)0x0;
  ossb->path = (size_t *)0x0;
  *(undefined8 *)(ossb + 1) = 0;
  ossb[1].buffer_size = 0;
  sp_seg_set_buffer_size(ossb,0x400);
  return ossb;
}

Assistant:

converter_t converter_open(void)
{
	converter_desc * converter = (converter_desc *)
			malloc(sizeof(converter_desc));

	converter->dictionary_set = NULL;
	converter->current_dictionary_group = NULL;

#if SEGMENT_METHOD == SEGMENT_SHORTEST_PATH
	converter->spseg_buffer.initialized = FALSE;
	converter->spseg_buffer.match_length = converter->spseg_buffer.min_len
			= converter->spseg_buffer.parent = converter->spseg_buffer.path = NULL;

	sp_seg_set_buffer_size(&converter->spseg_buffer, OPENCC_SP_SEG_DEFAULT_BUFFER_SIZE);
#endif

	return (converter_t) converter;
}